

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpComms.cpp
# Opt level: O0

void __thiscall helics::tcp::TcpComms::TcpComms(TcpComms *this)

{
  NetworkCommsInterface *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  thread_generation in_stack_ffffffffffffffe8;
  InterfaceTypes in_stack_ffffffffffffffef;
  
  NetworkCommsInterface::NetworkCommsInterface
            (in_RDI,in_stack_ffffffffffffffef,in_stack_ffffffffffffffe8);
  (in_RDI->super_CommsInterface)._vptr_CommsInterface = (_func_int **)&PTR__TcpComms_00a701d0;
  *(undefined1 *)&in_RDI[1].super_CommsInterface._vptr_CommsInterface = 0;
  std::__cxx11::string::string(unaff_retaddr);
  gmlc::containers::BlockingQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>::
  BlockingQueue((BlockingQueue<helics::ActionMessage,_std::mutex,_std::condition_variable> *)in_RDI)
  ;
  return;
}

Assistant:

TcpComms::TcpComms() noexcept: NetworkCommsInterface(gmlc::networking::InterfaceTypes::TCP) {}